

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::setProperty(FederateState *this,int timeProperty,Time propertyVal)

{
  bool bVar1;
  FederateStates FVar2;
  element_type *__d;
  milliseconds time;
  anon_class_8_1_8991fb9c *__args;
  pointer in_RDX;
  int in_ESI;
  ActionMessage *in_RDI;
  ActionMessage grantCheck;
  Time prevTimeout;
  shared_ptr<helics::MessageTimer> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int32_t in_stack_fffffffffffffe04;
  TimeCoordinator *in_stack_fffffffffffffe08;
  Time in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  int32_t index;
  ActionMessage *in_stack_fffffffffffffee0;
  MessageTimer *in_stack_fffffffffffffee8;
  undefined1 local_f0 [24];
  undefined2 local_d8;
  TimeRepresentation<count_time<9,_long>_> local_20 [4];
  
  index = (int32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  __args = (anon_class_8_1_8991fb9c *)(ulong)(in_ESI - 0x8f);
  switch(__args) {
  case (anon_class_8_1_8991fb9c *)0x0:
    in_RDI[3].stringData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
    break;
  case (anon_class_8_1_8991fb9c *)0x1:
    *(pointer *)(in_RDI + 4) = in_RDX;
    break;
  case (anon_class_8_1_8991fb9c *)0x2:
    in_RDI[3].stringData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
    *(pointer *)(in_RDI + 4) = in_RDX;
    break;
  default:
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x59f7c4);
    TimeCoordinator::setProperty
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,in_stack_fffffffffffffe10);
    break;
  case (anon_class_8_1_8991fb9c *)0x12:
    local_20[0].internalTimeCode._0_4_ = in_RDI[4].source_id;
    local_20[0].internalTimeCode._4_4_ = in_RDI[4].source_handle;
    *(pointer *)&in_RDI[4].source_id = in_RDX;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                      (local_20,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar1) {
      FVar2 = getState((FederateState *)0x59f560);
      if ((((FVar2 != CREATED) &&
           (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                              ((TimeRepresentation<count_time<9,_long>_> *)&in_RDI[4].source_id,
                               (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero), bVar1
           )) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[4].Te),
                 !bVar1)) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[4].Te), !bVar1))
      {
        std::
        make_shared<helics::MessageTimer,helics::FederateState::setProperty(int,TimeRepresentation<count_time<9,long>>)::__0>
                  (__args);
        std::shared_ptr<helics::MessageTimer>::operator=
                  ((shared_ptr<helics::MessageTimer> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   in_stack_fffffffffffffdf8);
        std::shared_ptr<helics::MessageTimer>::~shared_ptr
                  ((shared_ptr<helics::MessageTimer> *)0x59f5f8);
      }
      FVar2 = getState((FederateState *)0x59f606);
      if ((FVar2 == EXECUTING) && ((in_RDI[4].sequenceID & 1) == 0)) {
        ActionMessage::ActionMessage(in_RDI,(action_t)((ulong)local_f0 >> 0x20));
        ActionMessage::setExtraData
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (int32_t)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        local_d8 = 0;
        if (in_RDI[4].dest_handle.hid < 0) {
          __d = std::
                __shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x59f67b);
          time = TimeRepresentation<count_time<9,_long>_>::to_ms
                           ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffdf8);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)time.__r,
                     (duration<long,_std::ratio<1L,_1000L>_> *)__d);
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ActionMessage *)&stack0xfffffffffffffe38);
          in_stack_fffffffffffffe04 =
               MessageTimer::addTimerFromNow
                         (in_stack_fffffffffffffee8,(nanoseconds)time.__r,in_stack_fffffffffffffee0)
          ;
          in_RDI[4].dest_handle.hid = in_stack_fffffffffffffe04;
          ActionMessage::~ActionMessage
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))
          ;
        }
        ActionMessage::~ActionMessage
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      }
    }
    else {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                        ((TimeRepresentation<count_time<9,_long>_> *)&in_RDI[4].source_id,
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if ((bVar1) && (-1 < in_RDI[4].dest_handle.hid)) {
        std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x59f79f);
        MessageTimer::cancelTimer((MessageTimer *)in_RDI,index);
      }
    }
  }
  return;
}

Assistant:

void FederateState::setProperty(int timeProperty, Time propertyVal)
{
    switch (timeProperty) {
        case defs::Properties::RT_LAG:
            rt_lag = propertyVal;
            break;
        case defs::Properties::RT_LEAD:
            rt_lead = propertyVal;
            break;
        case defs::Properties::RT_TOLERANCE:
            rt_lag = propertyVal;
            rt_lead = propertyVal;
            break;
        case defs::Properties::GRANT_TIMEOUT: {
#ifndef HELICS_DISABLE_ASIO
            auto prevTimeout = grantTimeOutPeriod;
            grantTimeOutPeriod = propertyVal;
            if (prevTimeout == timeZero) {
                if (getState() >= FederateStates::INITIALIZING && grantTimeOutPeriod > timeZero) {
                    if (!mTimer) {
                        if (!mTimer) {
                            mTimer = std::make_shared<MessageTimer>([this](ActionMessage&& mess) {
                                return this->addAction(std::move(mess));
                            });
                        }
                    }
                }
                // if we are currently waiting for a grant trigger the timer
                if (getState() == FederateStates::EXECUTING && !timeGranted_mode) {
                    ActionMessage grantCheck(CMD_GRANT_TIMEOUT_CHECK);
                    grantCheck.setExtraData(static_cast<std::int32_t>(mGrantCount));
                    grantCheck.counter = 0;
                    if (grantTimeoutTimeIndex < 0) {
                        grantTimeoutTimeIndex = mTimer->addTimerFromNow(grantTimeOutPeriod.to_ms(),
                                                                        std::move(grantCheck));
                    }
                }
            } else if (grantTimeOutPeriod <= timeZero && grantTimeoutTimeIndex >= 0) {
                mTimer->cancelTimer(grantTimeoutTimeIndex);
            }
#else
            grantTimeOutPeriod = propertyVal;
#endif
        } break;
        default:
            timeCoord->setProperty(timeProperty, propertyVal);
            break;
    }
}